

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_dss_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  int iVar1;
  undefined1 local_98 [8];
  string_buf buf;
  size_t y_len;
  size_t g_len;
  size_t q_len;
  size_t p_len;
  uchar *y;
  uchar *g;
  uchar *q;
  uchar *p;
  DSA *dsactx;
  void **abstract_local;
  size_t hostkey_data_len_local;
  uchar *hostkey_data_local;
  LIBSSH2_SESSION *session_local;
  
  dsactx = (DSA *)abstract;
  abstract_local = (void **)hostkey_data_len;
  hostkey_data_len_local = (size_t)hostkey_data;
  hostkey_data_local = (uchar *)session;
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_dss_dtor(session,abstract);
    *(undefined8 *)dsactx = 0;
  }
  if (abstract_local < (void **)0x1b) {
    session_local._4_4_ = -1;
  }
  else {
    local_98 = (undefined1  [8])hostkey_data_len_local;
    buf.data = (uchar *)hostkey_data_len_local;
    buf.dataptr = (uchar *)abstract_local;
    iVar1 = _libssh2_match_string((string_buf *)local_98,"ssh-dss");
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_string((string_buf *)local_98,&q,&q_len);
      if (iVar1 == 0) {
        iVar1 = _libssh2_get_string((string_buf *)local_98,&g,&g_len);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_string((string_buf *)local_98,&y,&y_len);
          if (iVar1 == 0) {
            iVar1 = _libssh2_get_string((string_buf *)local_98,(uchar **)&p_len,&buf.len);
            if (iVar1 == 0) {
              iVar1 = _libssh2_eob((string_buf *)local_98);
              if (iVar1 == 0) {
                session_local._4_4_ = -1;
              }
              else {
                iVar1 = _libssh2_dsa_new((DSA **)&p,q,q_len,g,g_len,y,y_len,(uchar *)p_len,buf.len,
                                         (uchar *)0x0,0);
                if (iVar1 == 0) {
                  *(uchar **)dsactx = p;
                  session_local._4_4_ = 0;
                }
                else {
                  session_local._4_4_ = -1;
                }
              }
            }
            else {
              session_local._4_4_ = -1;
            }
          }
          else {
            session_local._4_4_ = -1;
          }
        }
        else {
          session_local._4_4_ = -1;
        }
      }
      else {
        session_local._4_4_ = -1;
      }
    }
    else {
      session_local._4_4_ = -1;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_dss_init(LIBSSH2_SESSION * session,
                            const unsigned char *hostkey_data,
                            size_t hostkey_data_len,
                            void **abstract)
{
    libssh2_dsa_ctx *dsactx;
    unsigned char *p, *q, *g, *y;
    size_t p_len, q_len, g_len, y_len;
    struct string_buf buf;

    if(*abstract) {
        hostkey_method_ssh_dss_dtor(session, abstract);
        *abstract = NULL;
    }

    if(hostkey_data_len < 27) {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "host key length too short"));
        return -1;
    }

    buf.data = (unsigned char *)hostkey_data;
    buf.dataptr = buf.data;
    buf.len = hostkey_data_len;

    if(_libssh2_match_string(&buf, "ssh-dss"))
        return -1;

    if(_libssh2_get_string(&buf, &p, &p_len))
        return -1;

    if(_libssh2_get_string(&buf, &q, &q_len))
        return -1;

    if(_libssh2_get_string(&buf, &g, &g_len))
        return -1;

    if(_libssh2_get_string(&buf, &y, &y_len))
        return -1;

    if(!_libssh2_eob(&buf))
        return -1;

    if(_libssh2_dsa_new(&dsactx,
                        p, (unsigned long)p_len,
                        q, (unsigned long)q_len,
                        g, (unsigned long)g_len,
                        y, (unsigned long)y_len,
                        NULL, 0)) {
        return -1;
    }

    *abstract = dsactx;

    return 0;
}